

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::SliderBehaviorT<int,int,float>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,int *v,int v_min,int v_max,
               char *format,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  float fVar1;
  bool bVar2;
  ImGuiContext *pIVar3;
  uint uVar4;
  float *pfVar5;
  bool is_logarithmic_00;
  bool bVar6;
  bool bVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float local_f0;
  float local_ec;
  float local_e8;
  int local_e0;
  int local_dc;
  ImRect local_d0;
  ImRect local_c0;
  float local_b0;
  float local_ac;
  float grab_pos;
  float grab_t;
  ImVec2 local_a0;
  int local_98;
  float local_94;
  int v_new_1;
  float new_clicked_t;
  int v_new;
  float old_clicked_t;
  float delta;
  int decimal_precision_1;
  float input_delta;
  ImVec2 input_delta2;
  float mouse_abs_pos;
  float clicked_t;
  bool set_new_value;
  float fStack_64;
  bool value_changed;
  int decimal_precision;
  float zero_deadzone_halfsize;
  float logarithmic_zero_epsilon;
  float slider_usable_pos_max;
  float slider_usable_pos_min;
  float slider_usable_sz;
  int v_range;
  float grab_sz;
  float slider_sz;
  float grab_padding;
  bool is_floating_point;
  bool is_logarithmic;
  ImGuiAxis axis;
  ImGuiStyle *style;
  ImGuiContext *g;
  int v_max_local;
  int v_min_local;
  int *v_local;
  ImGuiDataType data_type_local;
  ImGuiID id_local;
  ImRect *bb_local;
  
  pIVar3 = GImGui;
  uVar4 = (uint)((flags & 0x100000U) != 0);
  is_logarithmic_00 = (flags & 0x20U) != 0;
  bVar6 = data_type != 8;
  bVar7 = data_type != 9;
  fVar8 = ImVec2::operator[](&bb->Max,(long)(int)uVar4);
  fVar9 = ImVec2::operator[](&bb->Min,(long)(int)uVar4);
  fVar8 = (fVar8 - fVar9) - 4.0;
  slider_usable_sz = (pIVar3->Style).GrabMinSize;
  if (v_min < v_max) {
    local_dc = v_max - v_min;
  }
  else {
    local_dc = v_min - v_max;
  }
  if ((bVar6 && bVar7) && (-1 < local_dc)) {
    slider_usable_sz = ImMax<float>(fVar8 / (float)(local_dc + 1),(pIVar3->Style).GrabMinSize);
  }
  fVar9 = ImMin<float>(slider_usable_sz,fVar8);
  fVar10 = fVar8 - fVar9;
  fVar11 = ImVec2::operator[](&bb->Min,(long)(int)uVar4);
  fVar11 = fVar9 * 0.5 + fVar11 + 2.0;
  fVar12 = ImVec2::operator[](&bb->Max,(long)(int)uVar4);
  decimal_precision = 0;
  fStack_64 = 0.0;
  if (is_logarithmic_00) {
    if (bVar6 && bVar7) {
      local_e0 = 1;
    }
    else {
      local_e0 = ImParseFormatPrecision(format,3);
    }
    decimal_precision = (int)ImPow(0.1,(float)local_e0);
    fVar1 = (pIVar3->Style).LogSliderDeadzone;
    fStack_64 = ImMax<float>(fVar10,1.0);
    fStack_64 = (fVar1 * 0.5) / fStack_64;
  }
  mouse_abs_pos._3_1_ = false;
  if (pIVar3->ActiveId == id) {
    bVar2 = false;
    input_delta2.y = 0.0;
    if (pIVar3->ActiveIdSource == ImGuiInputSource_Mouse) {
      if (((pIVar3->IO).MouseDown[0] & 1U) == 0) {
        ClearActiveID();
      }
      else {
        pfVar5 = ImVec2::operator[](&(pIVar3->IO).MousePos,(long)(int)uVar4);
        input_delta2.x = *pfVar5;
        if (fVar10 <= 0.0) {
          local_e8 = 0.0;
        }
        else {
          local_e8 = ImClamp<float>((input_delta2.x - fVar11) / fVar10,0.0,1.0);
        }
        input_delta2.y = local_e8;
        if (uVar4 == 1) {
          input_delta2.y = 1.0 - local_e8;
        }
        bVar2 = true;
      }
    }
    else if (pIVar3->ActiveIdSource == ImGuiInputSource_Nav) {
      if ((pIVar3->ActiveIdIsJustActivated & 1U) != 0) {
        pIVar3->SliderCurrentAccum = 0.0;
        pIVar3->SliderCurrentAccumDirty = false;
      }
      _decimal_precision_1 = GetNavInputAmount2d(6,ImGuiInputReadMode_RepeatFast,0.0,0.0);
      if (uVar4 == 0) {
        local_ec = (float)decimal_precision_1;
      }
      else {
        local_ec = -input_delta;
      }
      delta = local_ec;
      if ((local_ec != 0.0) || (NAN(local_ec))) {
        if (bVar6 && bVar7) {
          local_f0 = 0.0;
        }
        else {
          local_f0 = (float)ImParseFormatPrecision(format,3);
        }
        old_clicked_t = local_f0;
        if ((int)local_f0 < 1) {
          if (((-100.0 <= (float)local_dc) && ((float)local_dc <= 100.0)) ||
             (bVar6 = IsNavInputDown(0xe), bVar6)) {
            delta = (float)(~-(uint)(delta < 0.0) & 0x3f800000 | -(uint)(delta < 0.0) & 0xbf800000)
                    / (float)local_dc;
          }
          else {
            delta = delta / 100.0;
          }
        }
        else {
          delta = delta / 100.0;
          bVar6 = IsNavInputDown(0xe);
          if (bVar6) {
            delta = delta / 10.0;
          }
        }
        bVar6 = IsNavInputDown(0xf);
        if (bVar6) {
          delta = delta * 10.0;
        }
        pIVar3->SliderCurrentAccum = delta + pIVar3->SliderCurrentAccum;
        pIVar3->SliderCurrentAccumDirty = true;
      }
      v_new = (int)pIVar3->SliderCurrentAccum;
      if ((pIVar3->NavActivatePressedId == id) && ((pIVar3->ActiveIdIsJustActivated & 1U) == 0)) {
        ClearActiveID();
      }
      else if ((pIVar3->SliderCurrentAccumDirty & 1U) != 0) {
        input_delta2.y =
             ScaleRatioFromValueT<int,int,float>
                       (data_type,*v,v_min,v_max,is_logarithmic_00,(float)decimal_precision,
                        fStack_64);
        if (((1.0 <= input_delta2.y) && (0.0 < (float)v_new)) ||
           ((input_delta2.y <= 0.0 && ((float)v_new < 0.0)))) {
          bVar2 = false;
          pIVar3->SliderCurrentAccum = 0.0;
        }
        else {
          bVar2 = true;
          new_clicked_t = input_delta2.y;
          input_delta2.y = ImSaturate(input_delta2.y + (float)v_new);
          v_new_1 = ScaleValueFromRatioT<int,int,float>
                              (data_type,input_delta2.y,v_min,v_max,is_logarithmic_00,
                               (float)decimal_precision,fStack_64);
          if ((flags & 0x40U) == 0) {
            v_new_1 = RoundScalarWithFormatT<int,int>(format,data_type,v_new_1);
          }
          local_94 = ScaleRatioFromValueT<int,int,float>
                               (data_type,v_new_1,v_min,v_max,is_logarithmic_00,
                                (float)decimal_precision,fStack_64);
          if ((float)v_new <= 0.0) {
            fVar10 = ImMax<float>(local_94 - new_clicked_t,(float)v_new);
            pIVar3->SliderCurrentAccum = pIVar3->SliderCurrentAccum - fVar10;
          }
          else {
            fVar10 = ImMin<float>(local_94 - new_clicked_t,(float)v_new);
            pIVar3->SliderCurrentAccum = pIVar3->SliderCurrentAccum - fVar10;
          }
        }
        pIVar3->SliderCurrentAccumDirty = false;
      }
    }
    if (bVar2) {
      local_98 = ScaleValueFromRatioT<int,int,float>
                           (data_type,input_delta2.y,v_min,v_max,is_logarithmic_00,
                            (float)decimal_precision,fStack_64);
      if ((flags & 0x40U) == 0) {
        local_98 = RoundScalarWithFormatT<int,int>(format,data_type,local_98);
      }
      mouse_abs_pos._3_1_ = *v != local_98;
      if (mouse_abs_pos._3_1_) {
        *v = local_98;
      }
    }
  }
  if (1.0 <= fVar8) {
    local_ac = ScaleRatioFromValueT<int,int,float>
                         (data_type,*v,v_min,v_max,is_logarithmic_00,(float)decimal_precision,
                          fStack_64);
    if (uVar4 == 1) {
      local_ac = 1.0 - local_ac;
    }
    local_b0 = ImLerp<float>(fVar11,-fVar9 * 0.5 + (fVar12 - 2.0),local_ac);
    if (uVar4 == 0) {
      ImRect::ImRect(&local_c0,-fVar9 * 0.5 + local_b0,(bb->Min).y + 2.0,fVar9 * 0.5 + local_b0,
                     (bb->Max).y - 2.0);
      out_grab_bb->Min = local_c0.Min;
      out_grab_bb->Max = local_c0.Max;
    }
    else {
      ImRect::ImRect(&local_d0,(bb->Min).x + 2.0,-fVar9 * 0.5 + local_b0,(bb->Max).x - 2.0,
                     fVar9 * 0.5 + local_b0);
      out_grab_bb->Min = local_d0.Min;
      out_grab_bb->Max = local_d0.Max;
    }
  }
  else {
    ImRect::ImRect((ImRect *)&grab_pos,&bb->Min,&bb->Min);
    out_grab_bb->Min = _grab_pos;
    out_grab_bb->Max = local_a0;
  }
  return mouse_abs_pos._3_1_;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) != 0;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_floating_point && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    float zero_deadzone_halfsize = 0.0f; // Only valid when is_logarithmic is true
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);
        zero_deadzone_halfsize = (style.LogSliderDeadzone * 0.5f) / ImMax(slider_usable_sz, 1.0f);
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            if (g.ActiveIdIsJustActivated)
            {
                g.SliderCurrentAccum = 0.0f; // Reset any stored nav delta upon activation
                g.SliderCurrentAccumDirty = false;
            }

            const ImVec2 input_delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float input_delta = (axis == ImGuiAxis_X) ? input_delta2.x : -input_delta2.y;
            if (input_delta != 0.0f)
            {
                const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 0;
                if (decimal_precision > 0)
                {
                    input_delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta = ((input_delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        input_delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    input_delta *= 10.0f;

                g.SliderCurrentAccum += input_delta;
                g.SliderCurrentAccumDirty = true;
            }

            float delta = g.SliderCurrentAccum;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (g.SliderCurrentAccumDirty)
            {
                clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                {
                    set_new_value = false;
                    g.SliderCurrentAccum = 0.0f; // If pushing up against the limits, don't continue to accumulate
                }
                else
                {
                    set_new_value = true;
                    float old_clicked_t = clicked_t;
                    clicked_t = ImSaturate(clicked_t + delta);

                    // Calculate what our "new" clicked_t will be, and thus how far we actually moved the slider, and subtract this from the accumulator
                    TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
                    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                        v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);
                    float new_clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                    if (delta > 0)
                        g.SliderCurrentAccum -= ImMin(new_clicked_t - old_clicked_t, delta);
                    else
                        g.SliderCurrentAccum -= ImMax(new_clicked_t - old_clicked_t, delta);
                }

                g.SliderCurrentAccumDirty = false;
            }
        }

        if (set_new_value)
        {
            TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

            // Round to user desired precision based on format string
            if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}